

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<int,(unsigned_char)4>>(Thread *this)

{
  u8 i;
  long lVar1;
  uint value;
  Simd<int,_(unsigned_char)__x04_> val;
  
  val = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  value = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    value = value | val.v[lVar1] >> 0x1f & 1 << ((byte)lVar1 & 0x1f);
  }
  Push<unsigned_int>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}